

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O0

_Bool project_p(source origin,wchar_t r,loc_conflict grid,wchar_t dam,wchar_t typ,wchar_t power,
               _Bool self)

{
  player *p;
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  object *poVar4;
  anon_union_8_5_62f3dbed_for_which_conflict1 obj_00;
  bool bVar5;
  int local_120;
  wchar_t local_11c;
  wchar_t xtra;
  wchar_t reduced;
  wchar_t shield_ac;
  object *shld;
  wchar_t armor;
  chest_trap *trap_1;
  object *obj;
  trap *trap;
  project_player_handler_context_t context;
  project_player_handler_f player_handler;
  char killer [80];
  monster_conflict *local_40;
  monster *mon;
  _Bool obvious;
  _Bool seen;
  _Bool blind;
  _Bool self_local;
  wchar_t typ_local;
  wchar_t dam_local;
  wchar_t r_local;
  loc_conflict grid_local;
  source origin_local;
  
  obj_00 = origin.which;
  bVar5 = player->timed[2] == 0;
  local_40 = (monster_conflict *)0x0;
  context._40_8_ = player_handlers[typ];
  trap = (trap *)CONCAT44(grid_local.y,origin.what);
  context.dam = power;
  context.type._0_1_ = 1;
  context.origin._0_8_ = obj_00;
  context.origin.which.monster = r;
  context._12_8_ = grid;
  context.grid.x = dam;
  context.grid.y = typ;
  _Var1 = square_isdecoyed((chunk *)cave,grid);
  if ((_Var1) && (context.grid.x != L'\0')) {
    square_destroy_decoy((chunk *)cave,grid);
  }
  _Var1 = square_isplayer((chunk *)cave,grid);
  if (!_Var1) {
    return false;
  }
  _Var1 = square_isprotect((chunk *)cave,grid);
  if (_Var1) {
    _Var1 = square_isrubble((chunk *)cave,grid);
    if ((_Var1) && (uVar3 = Rand_div(10), uVar3 == 0)) {
      msg("You duck behind a boulder!");
      return false;
    }
    _Var1 = square_istree((chunk *)cave,grid);
    if (((_Var1) && (uVar3 = Rand_div(8), uVar3 == 0)) &&
       ((_Var1 = flag_has_dbg((player->state).pflags,10,0x30,"player->state.pflags","(PF_WOODSMAN)")
        , _Var1 ||
        (_Var1 = flag_has_dbg((player->state).pflags,10,0x16,"player->state.pflags","(PF_ELVEN)"),
        _Var1)))) {
      msg("You dodge behind a tree!");
      return false;
    }
  }
  switch(origin.what) {
  case SRC_NONE:
  case SRC_GRID:
    my_strcpy((char *)&player_handler,"a bug",0x50);
    break;
  case SRC_TRAP:
    strnfmt((char *)&player_handler,0x50,"a %s",((ego_item *)(obj_00.trap)->kind)->text);
    break;
  case SRC_PLAYER:
    if (!self) {
      return false;
    }
    my_strcpy((char *)&player_handler,"yourself",0x50);
    break;
  case SRC_MONSTER:
    origin_local.what = origin.which._0_4_;
    local_40 = cave_monster(cave,origin_local.what);
    _Var1 = monster_is_visible((monster *)local_40);
    bVar5 = _Var1 && bVar5;
    monster_desc((char *)&player_handler,0x50,(monster *)local_40,L'\x88');
    update_smart_learn((monster *)local_40,player,L'\0',L'\0',typ);
    break;
  case SRC_OBJECT:
    object_desc((char *)&player_handler,0x50,obj_00.object,0x40,player);
    break;
  case SRC_CHEST_TRAP:
    strnfmt((char *)&player_handler,0x50,"%s",(obj_00.chest_trap)->msg_death);
  }
  p = player;
  if ((typ == L'\x1b') && (local_40 != (monster_conflict *)0x0)) {
    local_120 = (player->state).ac + (player->state).to_a;
    wVar2 = slot_by_name(player,"arm");
    poVar4 = slot_object(p,wVar2);
    if (poVar4 == (object *)0x0) {
      local_11c = L'\0';
    }
    else {
      local_11c = (wchar_t)poVar4->ac;
    }
    xtra = local_11c;
    if (((player->state).shield_on_back & 1U) == 0) {
      _Var1 = flag_has_dbg((player->state).pflags,10,0x33,"player->state.pflags","(PF_SHIELD_MAST)")
      ;
      if (_Var1) {
        xtra = local_11c + L'\x03';
      }
    }
    else {
      xtra = L'\0';
    }
    uVar3 = Rand_div(0x50);
    if (uVar3 + L'\x01' <= (player->state).evasion_chance) {
      msg("You evade the missile!");
      disturb(player);
      return true;
    }
    if (0x96 < local_120) {
      local_120 = 0x96;
    }
    uVar3 = Rand_div((local_40->race->level + L'\n') * 0x14);
    if ((int)(uVar3 + 1) < local_120) {
      msg("The missile glances off your armour.");
    }
    else {
      wVar2 = Rand_div(0x78);
      if (wVar2 < xtra) {
        msg("The missile ricochets off your shield.");
      }
    }
  }
  if (!bVar5) {
    msg("You are hit by %s!",projections[typ].blind_desc);
  }
  context.grid.x = terrain_adjust_dam(player,(monster *)0x0,typ,context.grid.x);
  context.grid.x = adjust_dam(player,typ,context.grid.x,true);
  if (context.grid.x != L'\0') {
    if (self) {
      context.grid.x = context.grid.x / 10;
    }
    wVar2 = player_apply_damage_reduction(player,context.grid.x);
    if ((L'\0' < wVar2) && (((player->opts).opt[3] & 1U) != 0)) {
      msg("You take %d damage.",(ulong)(uint)wVar2);
    }
    take_hit(player,wVar2,(char *)&player_handler);
  }
  if ((context._40_8_ != 0) && ((player->is_dead & 1U) == 0)) {
    wVar2 = (*(code *)context._40_8_)(&trap);
    wVar2 = player_apply_damage_reduction(player,wVar2);
    if ((L'\0' < wVar2) && (((player->opts).opt[3] & 1U) != 0)) {
      msg("You take an extra %d damage.",(ulong)(uint)wVar2);
    }
    take_hit(player,wVar2,(char *)&player_handler);
  }
  disturb(player);
  return (_Bool)((byte)context.type & 1);
}

Assistant:

bool project_p(struct source origin, int r, struct loc grid, int dam, int typ,
			   int power, bool self)
{
	bool blind = (player->timed[TMD_BLIND] ? true : false);
	bool seen = !blind;
	bool obvious = true;
	struct monster *mon = NULL;

	/* Monster or trap name (for damage) */
	char killer[80];

	project_player_handler_f player_handler = player_handlers[typ];
	project_player_handler_context_t context = {
		origin,
		r,
		grid,
		dam,
		typ,
		power,
		obvious
	};

	/* Decoy has been hit */
	if (square_isdecoyed(cave, grid) && context.dam) {
		square_destroy_decoy(cave, grid);
	}

	/* No player here */
	if (!square_isplayer(cave, grid)) {
		return false;
	}

	/* Determine if terrain is capable of preventing physical damage. */
	if (square_isprotect(cave, grid)) {
		/* A player behind rubble can duck. */
		if (square_isrubble(cave, grid) && one_in_(10)) {
			msg("You duck behind a boulder!");
			return false;
		}

		/* Rangers, elves and druids can take cover in trees. */
		if (square_istree(cave, grid) && one_in_(8) &&
			(player_has(player, PF_WOODSMAN) || player_has(player, PF_ELVEN))) {
			msg("You dodge behind a tree!");
			return false;
		}
	}

	switch (origin.what) {
		case SRC_PLAYER: {
			/* Don't affect projector unless explicitly allowed */
			if (!self) return false;
			/* Use the same message as the DAMAGE handler. */
			my_strcpy(killer, "yourself", sizeof(killer));
			break;
		}

		case SRC_MONSTER: {
			mon = cave_monster(cave, origin.which.monster);

			/* Check it is visible */
			if (!monster_is_visible(mon))
				seen = false;

			/* Get the monster's real name */
			monster_desc(killer, sizeof(killer), mon, MDESC_DIED_FROM);

			/* Monster sees what is going on */
			update_smart_learn(mon, player, 0, 0, typ);

			break;
		}

		case SRC_TRAP: {
			struct trap *trap = origin.which.trap;

			/* Get the trap name */
			strnfmt(killer, sizeof(killer), "a %s", trap->kind->desc);

			break;
		}

		case SRC_OBJECT: {
			struct object *obj = origin.which.object;
			object_desc(killer, sizeof(killer), obj,
				ODESC_PREFIX | ODESC_BASE, player);
			break;
		}

		case SRC_CHEST_TRAP: {
			struct chest_trap *trap = origin.which.chest_trap;

			/* Get the trap name */
			strnfmt(killer, sizeof(killer), "%s", trap->msg_death);

			break;
		}

		case SRC_GRID:
		case SRC_NONE: {
			/* Use the same message as the DAMAGE handler. */
			my_strcpy(killer, "a bug", sizeof(killer));
			break;
		}
		default: break;
	}

	/* Try to evade or deflect missiles */
	if ((typ == ELEM_ARROW) && mon) {
		/* Get effective armor values */
		int armor = player->state.ac + player->state.to_a;
		struct object *shld = slot_object(player, slot_by_name(player, "arm"));
		int shield_ac = shld ? shld->ac : 0;
		if (player->state.shield_on_back) {
			shield_ac = 0;
		} else if (player_has(player, PF_SHIELD_MAST)) {
			shield_ac += 3;
		}

		if (randint1(80) <= player->state.evasion_chance) {
			/* Evasion */
			msg("You evade the missile!");
			disturb(player);
			return true;
		} else if (MIN(armor, 150) > randint1((10 + mon->race->level) * 20)) {
			/* Armor deflection */
			msg("The missile glances off your armour.");
		} else if (shield_ac > randint0(20 * 6)) {
			/* Shield deflection (20 is max shield AC) */
			msg("The missile ricochets off your shield.");
		}
	}

	/* Let player know what is going on */
	if (!seen) {
		msg("You are hit by %s!", projections[typ].blind_desc);
	}

	/* Adjust damage for terrain and element properties, and apply it */
	context.dam = terrain_adjust_dam(player, NULL, typ, context.dam);
	context.dam = adjust_dam(player, typ, context.dam, true);
	if (context.dam) {
		int reduced;

		/* Self-inflicted damage is scaled down */
		if (self) {
			context.dam /= 10;
		}
		/*
		 * Account for the player's damage reduction.   That does not
		 * affect the side effects (i.e. player_handler), so leave
		 * context.dam unmodified.
		 */
		reduced = player_apply_damage_reduction(player, context.dam);
		if (reduced > 0 && OPT(player, show_damage)) {
			msg("You take %d damage.", reduced);
		}
		take_hit(player, reduced, killer);
	}

	/* Handle side effects, possibly including extra damage */
	if (player_handler != NULL && player->is_dead == false) {
		int xtra = player_handler(&context);

		xtra = player_apply_damage_reduction(player, xtra);
		if (xtra > 0 && OPT(player, show_damage)) {
			msg("You take an extra %d damage.", xtra);
		}
		take_hit(player, xtra, killer);
	}

	/* Disturb */
	disturb(player);

	/* Return "Anything seen?" */
	return context.obvious;
}